

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * __thiscall kj::ReadableFile::readAllText(String *__return_storage_ptr__,ReadableFile *this)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  String local_48 [2];
  
  (*(this->super_FsNode)._vptr_FsNode[2])(local_48);
  heapString(__return_storage_ptr__,local_48[0].content.size_);
  pcVar7 = (char *)(__return_storage_ptr__->content).size_;
  pcVar5 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->content).ptr;
  }
  pcVar4 = pcVar7 + -1;
  if (pcVar7 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  iVar3 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,pcVar5,pcVar4);
  sVar1 = (__return_storage_ptr__->content).size_;
  uVar6 = 0;
  if (sVar1 != 0) {
    uVar6 = sVar1 - 1;
  }
  if (CONCAT44(extraout_var,iVar3) < uVar6) {
    if (sVar1 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (__return_storage_ptr__->content).ptr;
    }
    heapString(local_48,pcVar7,CONCAT44(extraout_var,iVar3));
    pcVar7 = (__return_storage_ptr__->content).ptr;
    if (pcVar7 != (char *)0x0) {
      sVar1 = (__return_storage_ptr__->content).size_;
      pAVar2 = (__return_storage_ptr__->content).disposer;
      (__return_storage_ptr__->content).ptr = (char *)0x0;
      (__return_storage_ptr__->content).size_ = 0;
      (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar7,1,sVar1,sVar1,0);
    }
    (__return_storage_ptr__->content).ptr = local_48[0].content.ptr;
    (__return_storage_ptr__->content).size_ = local_48[0].content.size_;
    (__return_storage_ptr__->content).disposer = local_48[0].content.disposer;
  }
  return __return_storage_ptr__;
}

Assistant:

String ReadableFile::readAllText() const {
  String result = heapString(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapString(result.slice(0, n));
  }
  return result;
}